

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O3

Alignment * __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Align
          (Alignment *__return_storage_ptr__,SimdAlignmentEngine<(spoa::Architecture)3> *this,
          char *sequence,uint32_t sequence_len,Graph *graph,int32_t *score)

{
  uint8_t num_codes;
  AlignmentSubtype AVar1;
  pointer puVar2;
  pointer puVar3;
  int64_t iVar4;
  invalid_argument *this_00;
  uint64_t matrix_height;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if ((int)sequence_len < 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[spoa::SimdAlignmentEngine::Align] error: too large sequence!");
LAB_0010cf00:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  puVar2 = (graph->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (graph->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (sequence_len != 0 && puVar2 != puVar3) {
    iVar4 = AlignmentEngine::WorstCaseAlignmentScore
                      (&this->super_AlignmentEngine,(ulong)(sequence_len + 8),
                       (long)puVar3 - (long)puVar2 >> 3);
    if (iVar4 < -0x7ffffc00) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"[spoa::SimdAlignmentEngine::Align] error: possible overflow!");
      goto LAB_0010cf00;
    }
    num_codes = (uint8_t)graph->num_codes_;
    matrix_height =
         ((long)(graph->nodes_).
                super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(graph->nodes_).
                super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) + 1;
    if (iVar4 < -0x7c00) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (double)(int)sequence_len * 0.125;
      auVar7 = vroundsd_avx(auVar6,auVar6,10);
      uVar5 = vcvttsd2usi_avx512f(auVar7);
      Realloc(this,uVar5,matrix_height,num_codes);
      Initialize<spoa::InstructionSet<(spoa::Architecture)3,int>>
                (this,sequence,graph,(ulong)sequence_len,uVar5,
                 ((long)(graph->nodes_).
                        super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(graph->nodes_).
                        super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
      AVar1 = (this->super_AlignmentEngine).subtype_;
      if (AVar1 == kConvex) {
        Convex<spoa::InstructionSet<(spoa::Architecture)3,int>>
                  (__return_storage_ptr__,this,sequence_len,graph,score);
        return __return_storage_ptr__;
      }
      if (AVar1 == kAffine) {
        Affine<spoa::InstructionSet<(spoa::Architecture)3,int>>
                  (__return_storage_ptr__,this,sequence_len,graph,score);
        return __return_storage_ptr__;
      }
      if (AVar1 == kLinear) {
        Linear<spoa::InstructionSet<(spoa::Architecture)3,int>>
                  (__return_storage_ptr__,this,sequence_len,graph,score);
        return __return_storage_ptr__;
      }
    }
    else {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (double)(int)sequence_len * 0.0625;
      auVar7 = vroundsd_avx(auVar7,auVar7,10);
      uVar5 = vcvttsd2usi_avx512f(auVar7);
      Realloc(this,uVar5,matrix_height,num_codes);
      Initialize<spoa::InstructionSet<(spoa::Architecture)3,short>>
                (this,sequence,graph,(ulong)sequence_len,uVar5,
                 ((long)(graph->nodes_).
                        super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(graph->nodes_).
                        super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
      AVar1 = (this->super_AlignmentEngine).subtype_;
      if (AVar1 == kConvex) {
        Convex<spoa::InstructionSet<(spoa::Architecture)3,short>>
                  (__return_storage_ptr__,this,sequence_len,graph,score);
        return __return_storage_ptr__;
      }
      if (AVar1 == kAffine) {
        Affine<spoa::InstructionSet<(spoa::Architecture)3,short>>
                  (__return_storage_ptr__,this,sequence_len,graph,score);
        return __return_storage_ptr__;
      }
      if (AVar1 == kLinear) {
        Linear<spoa::InstructionSet<(spoa::Architecture)3,short>>
                  (__return_storage_ptr__,this,sequence_len,graph,score);
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

Alignment SimdAlignmentEngine<A>::Align(
    const char* sequence, std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) {
  if (sequence_len > std::numeric_limits<int32_t>::max()) {
    throw std::invalid_argument(
        "[spoa::SimdAlignmentEngine::Align] error: too large sequence!");
  }

  if (graph.nodes().empty() || sequence_len == 0) {
    return Alignment();
  }

#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)

  std::int64_t worst_case_score = WorstCaseAlignmentScore(
      sequence_len + 8,
      graph.nodes().size());

  if (worst_case_score < std::numeric_limits<std::int32_t>::min() + 1024) {
    throw std::invalid_argument(
        "[spoa::SimdAlignmentEngine::Align] error: possible overflow!");
  } else if (worst_case_score < std::numeric_limits<std::int16_t>::min() + 1024) {  // NOLINT
    try {
      Realloc(
          std::ceil(static_cast<double>(sequence_len) / InstructionSet<A, std::int32_t>::kNumVar),  // NOLINT
          graph.nodes().size() + 1,
          graph.num_codes());
    } catch (std::bad_alloc& ba) {
      throw std::invalid_argument(
          "[spoa::SimdAlignmentEngine::Align] error: insufficient memory!");
    }
    Initialize<InstructionSet<A, std::int32_t>>(
        sequence,
        graph,
        sequence_len,
        std::ceil(static_cast<double>(sequence_len) / InstructionSet<A, std::int32_t>::kNumVar),  // NOLINT
        graph.nodes().size() + 1);

    if (subtype_ == AlignmentSubtype::kLinear) {
      return Linear<InstructionSet<A, std::int32_t>>(sequence_len, graph, score);  // NOLINT
    } else if (subtype_ == AlignmentSubtype::kAffine) {
      return Affine<InstructionSet<A, std::int32_t>>(sequence_len, graph, score);  // NOLINT
    } else if (subtype_ == AlignmentSubtype::kConvex) {
      return Convex<InstructionSet<A, std::int32_t>>(sequence_len, graph, score);  // NOLINT
    }
  } else {
    try {
      Realloc(
          std::ceil(static_cast<double>(sequence_len) / InstructionSet<A, std::int16_t>::kNumVar),  // NOLINT
          graph.nodes().size() + 1,
          graph.num_codes());
    } catch (std::bad_alloc& ba) {
      throw std::invalid_argument(
          "[spoa::SimdAlignmentEngine::Align] error: insufficient memory!");
    }
    Initialize<InstructionSet<A, std::int16_t>>(
        sequence,
        graph,
        sequence_len,
        std::ceil(static_cast<double>(sequence_len) / InstructionSet<A, std::int16_t>::kNumVar),  // NOLINT
        graph.nodes().size() + 1);

    if (subtype_ == AlignmentSubtype::kLinear) {
      return Linear<InstructionSet<A, std::int16_t>>(sequence_len, graph, score);  // NOLINT
    } else if (subtype_ == AlignmentSubtype::kAffine) {
      return Affine<InstructionSet<A, std::int16_t>>(sequence_len, graph, score);  // NOLINT
    } else if (subtype_ == AlignmentSubtype::kConvex) {
      return Convex<InstructionSet<A, std::int16_t>>(sequence_len, graph, score);  // NOLINT
    }
  }

#endif
  (void) sequence;
  (void) score;
  return Alignment();
}